

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

Var __thiscall
Js::TypedArrayBase::FindMinOrMax<short,false>
          (TypedArrayBase *this,ScriptContext *scriptContext,bool findMax)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  short *psVar4;
  code *pcVar5;
  bool bVar6;
  uint uVar7;
  undefined4 *puVar8;
  Var pvVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  short local_32;
  
  psVar4 = (short *)this->buffer;
  uVar2 = (this->super_ArrayBufferParent).super_ArrayObject.length;
  uVar3 = this->byteOffset;
  uVar7 = (*(((this->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar7 < (ulong)uVar3 + 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x9e8,
                                "(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())",
                                "sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()");
    if (!bVar6) {
LAB_00c039cf:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  else {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  lVar11 = 0;
  sVar1 = *psVar4;
LAB_00c0390c:
  do {
    local_32 = sVar1;
    lVar10 = lVar11 * 2;
    lVar12 = lVar11;
    do {
      while( true ) {
        lVar10 = lVar10 + 2;
        lVar11 = lVar12 + 1;
        if (lVar11 - (ulong)uVar2 == 1) {
          pvVar9 = JavascriptNumber::ToVarNoCheck((double)(int)local_32,scriptContext);
          return pvVar9;
        }
        uVar3 = this->byteOffset;
        uVar7 = (*(((this->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x71])();
        if ((ulong)uVar7 < (ulong)uVar3 + lVar10) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                      ,0x9ec,
                                      "((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                      ,
                                      "(i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                     );
          if (!bVar6) goto LAB_00c039cf;
          *puVar8 = 0;
        }
        sVar1 = psVar4[lVar12];
        lVar12 = lVar11;
        if (!findMax) break;
        if (local_32 < sVar1) goto LAB_00c0390c;
      }
    } while (local_32 <= sVar1);
  } while( true );
}

Assistant:

Var TypedArrayBase::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        T* typedBuffer = (T*)this->buffer;
        uint len = this->GetLength();

        Assert(sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
        T currentRes = typedBuffer[0];
        for (uint i = 0; i < len; i++)
        {
            Assert((i + 1) * sizeof(T)+GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            T compare = typedBuffer[i];
            if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
            {
                return scriptContext->GetLibrary()->GetNaN();
            }
            if (findMax ? currentRes < compare : currentRes > compare ||
                (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
            {
                currentRes = compare;
            }
        }
        return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
    }